

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZX8081.cpp
# Opt level: O1

shared_ptr<Storage::Data::ZX8081::File> __thiscall
Storage::Data::ZX8081::FileFromData
          (ZX8081 *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  ushort uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  long lVar6;
  bool bVar7;
  shared_ptr<Storage::Data::ZX8081::File> sVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> name_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  element_type *local_58;
  wstring local_50;
  
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar4 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) < 0xc) {
    lVar6 = 0;
    bVar7 = false;
  }
  else {
    lVar6 = 0;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa;
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xb;
    local_58 = (element_type *)this;
    do {
      if (lVar6 == 0xb) {
        lVar6 = 0xb;
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff;
        break;
      }
      local_50._M_dataplus._M_p._0_1_ = puVar4[lVar6] & 0x3f;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&local_78,(uchar *)&local_50);
      puVar4 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      in_RDX._M_pi = extraout_RDX;
      p_Var3 = p_Var2;
      if ((char)puVar4[lVar6] < '\0') break;
      lVar6 = lVar6 + 1;
      in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&p_Var2[-1]._M_weak_count + 3);
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)&p_Var5[-1]._M_weak_count + 3)
      ;
      bVar7 = p_Var2 < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish + -(long)puVar4);
      p_Var2 = in_RDX._M_pi;
      p_Var5 = p_Var3;
    } while (bVar7);
    bVar7 = p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (ZX8081 *)local_58;
  }
  if (!bVar7) {
    puVar4 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish + -(long)puVar4);
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(lVar6 + 0x56);
    if ((in_RDX._M_pi <= p_Var2) &&
       (p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (((ulong)*(ushort *)(puVar4 + lVar6 + 0xc) + lVar6) - 0x4008), p_Var5 <= p_Var2)) {
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
      p_Var3->_M_use_count = 1;
      p_Var3->_M_weak_count = 1;
      p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005a9e68;
      p_Var3[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var3[2]._M_use_count = 0;
      p_Var3[2]._M_weak_count = 0;
      p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var3[3]._M_use_count = 0;
      p_Var3[3]._M_weak_count = 0;
      p_Var3[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var3[1]._M_use_count = 0;
      p_Var3[1]._M_weak_count = 0;
      p_Var3[4]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var3[4]._M_use_count = 0;
      p_Var3[4]._M_weak_count = 0;
      *(_Atomic_word **)&p_Var3[2]._M_use_count = &p_Var3[3]._M_use_count;
      p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var3[3]._M_use_count = 0;
      StringFromData_abi_cxx11_
                (&local_50,(ZX8081 *)&local_78,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1,SUB81(p_Var5,0));
      p_Var2 = p_Var3 + 1;
      std::__cxx11::wstring::operator=((wstring *)&p_Var3[2]._M_use_count,(wstring *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,(byte)local_50._M_dataplus._M_p) !=
          &local_50.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_50._M_dataplus._M_p._1_7_,(byte)local_50._M_dataplus._M_p),
                        local_50.field_2._M_allocated_capacity * 4 + 4);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)p_Var2,data);
      *(undefined1 *)&p_Var3[4]._M_use_count = 1;
      in_RDX._M_pi = extraout_RDX_02;
      goto LAB_00431fa0;
    }
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00431fa0:
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    in_RDX._M_pi = extraout_RDX_00;
  }
  if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    puVar4 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish + -(long)puVar4);
    if ((((in_RDX._M_pi < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x28) ||
         (uVar1 = *(ushort *)(puVar4 + 10),
         in_RDX._M_pi < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)uVar1 - 0x4000))) ||
        (uVar1 < *(ushort *)(puVar4 + 8))) || (*(ushort *)(puVar4 + 0xc) < uVar1)) {
      (((element_type *)this)->data).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (((element_type *)this)->data).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
    }
    else {
      (((element_type *)this)->data).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      puVar4 = (pointer)operator_new(0x50);
      puVar4[8] = '\x01';
      puVar4[9] = '\0';
      puVar4[10] = '\0';
      puVar4[0xb] = '\0';
      puVar4[0xc] = '\x01';
      puVar4[0xd] = '\0';
      puVar4[0xe] = '\0';
      puVar4[0xf] = '\0';
      *(undefined ***)puVar4 = &PTR___Sp_counted_ptr_inplace_005a9e68;
      puVar4[0x20] = '\0';
      puVar4[0x21] = '\0';
      puVar4[0x22] = '\0';
      puVar4[0x23] = '\0';
      puVar4[0x24] = '\0';
      puVar4[0x25] = '\0';
      puVar4[0x26] = '\0';
      puVar4[0x27] = '\0';
      puVar4[0x28] = '\0';
      puVar4[0x29] = '\0';
      puVar4[0x2a] = '\0';
      puVar4[0x2b] = '\0';
      puVar4[0x2c] = '\0';
      puVar4[0x2d] = '\0';
      puVar4[0x2e] = '\0';
      puVar4[0x2f] = '\0';
      puVar4[0x30] = '\0';
      puVar4[0x31] = '\0';
      puVar4[0x32] = '\0';
      puVar4[0x33] = '\0';
      puVar4[0x34] = '\0';
      puVar4[0x35] = '\0';
      puVar4[0x36] = '\0';
      puVar4[0x37] = '\0';
      puVar4[0x38] = '\0';
      puVar4[0x39] = '\0';
      puVar4[0x3a] = '\0';
      puVar4[0x3b] = '\0';
      puVar4[0x3c] = '\0';
      puVar4[0x3d] = '\0';
      puVar4[0x3e] = '\0';
      puVar4[0x3f] = '\0';
      puVar4[0x10] = '\0';
      puVar4[0x11] = '\0';
      puVar4[0x12] = '\0';
      puVar4[0x13] = '\0';
      puVar4[0x14] = '\0';
      puVar4[0x15] = '\0';
      puVar4[0x16] = '\0';
      puVar4[0x17] = '\0';
      puVar4[0x18] = '\0';
      puVar4[0x19] = '\0';
      puVar4[0x1a] = '\0';
      puVar4[0x1b] = '\0';
      puVar4[0x1c] = '\0';
      puVar4[0x1d] = '\0';
      puVar4[0x1e] = '\0';
      puVar4[0x1f] = '\0';
      puVar4[0x40] = '\0';
      puVar4[0x41] = '\0';
      puVar4[0x42] = '\0';
      puVar4[0x43] = '\0';
      puVar4[0x44] = '\0';
      puVar4[0x45] = '\0';
      puVar4[0x46] = '\0';
      puVar4[0x47] = '\0';
      puVar4[0x48] = '\0';
      puVar4[0x49] = '\0';
      puVar4[0x4a] = '\0';
      puVar4[0x4b] = '\0';
      puVar4[0x4c] = '\0';
      puVar4[0x4d] = '\0';
      puVar4[0x4e] = '\0';
      puVar4[0x4f] = '\0';
      *(pointer *)(puVar4 + 0x28) = puVar4 + 0x38;
      puVar4[0x30] = '\0';
      puVar4[0x31] = '\0';
      puVar4[0x32] = '\0';
      puVar4[0x33] = '\0';
      puVar4[0x34] = '\0';
      puVar4[0x35] = '\0';
      puVar4[0x36] = '\0';
      puVar4[0x37] = '\0';
      puVar4[0x38] = '\0';
      puVar4[0x39] = '\0';
      puVar4[0x3a] = '\0';
      puVar4[0x3b] = '\0';
      (((element_type *)this)->data).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar4;
      (((element_type *)this)->data).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar4 + 0x10;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(puVar4 + 0x10),data);
      puVar4[0x48] = '\0';
      in_RDX._M_pi = extraout_RDX_03;
    }
  }
  else {
    (((element_type *)this)->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var2;
    (((element_type *)this)->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var3;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    in_RDX._M_pi = extraout_RDX_01;
  }
  sVar8.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = in_RDX._M_pi;
  sVar8.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Data::ZX8081::File>)
         sVar8.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<File> Storage::Data::ZX8081::FileFromData(const std::vector<uint8_t> &data) {
	std::shared_ptr<Storage::Data::ZX8081::File> result = ZX81FileFromData(data);
	if(result) return result;
	return ZX80FileFromData(data);
}